

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NetPortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetPortHeaderSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,DataTypeSyntax *args_2)

{
  Token netType;
  Token direction;
  NetPortHeaderSyntax *pNVar1;
  Info *in_RCX;
  long in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pNVar1 = (NetPortHeaderSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  direction.info = in_RSI;
  direction.kind = (short)in_RDX;
  direction._2_1_ = (char)((ulong)in_RDX >> 0x10);
  direction.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  direction.rawLen = (int)((ulong)in_RDX >> 0x20);
  netType.info = in_RCX;
  netType._0_8_ = in_RSI->location;
  slang::syntax::NetPortHeaderSyntax::NetPortHeaderSyntax
            ((NetPortHeaderSyntax *)in_RSI->rawTextPtr,direction,netType,
             *(DataTypeSyntax **)(in_RDX + 8));
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }